

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::Reporter::warning<std::__cxx11::string_const&>
          (Reporter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<> fmt_00;
  format_string<> fmt_01;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0xc;
  ::fmt::v10::print<std::__cxx11::string&>((v10 *)&std::cerr,(ostream *)"{} warning: ",fmt,in_R8);
  fmt_00.str_.size_ = (size_t)this;
  fmt_00.str_.data_ = (char *)args->_M_string_length;
  ::fmt::v10::print<>((v10 *)&std::cerr,(ostream *)(args->_M_dataplus)._M_p,fmt_00);
  fmt_01.str_.size_ = (size_t)this;
  fmt_01.str_.data_ = (char *)0x1;
  ::fmt::v10::print<>((v10 *)&std::cerr,(ostream *)0x1cebe2,fmt_01);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }